

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  bVar2 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar2) {
    pFVar1 = this->descriptor_;
    Options::Options(&local_78,&this->context_->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_78,false,false,false);
    Options::~Options(&local_78);
    text._M_str = "$deprecation$boolean ${$has$capitalized_name$$}$();\n";
    text._M_len = 0x34;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  }
  pFVar1 = this->descriptor_;
  Options::Options(&local_c8,&this->context_->options_);
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_c8,false,false,false);
  Options::~Options(&local_c8);
  text_00._M_str = "$deprecation$java.lang.String ${$get$capitalized_name$$}$();\n";
  text_00._M_len = 0x3d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_00);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  Options::Options(&local_118,&this->context_->options_);
  WriteFieldStringBytesAccessorDocComment(printer,pFVar1,GETTER,&local_118,false,false,false);
  Options::~Options(&local_118);
  text_01._M_str =
       "$deprecation$com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$();\n";
  text_01._M_len = 0x54;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_01);
  begin_varname_01._M_str = "{";
  begin_varname_01._M_len = 1;
  end_varname_01._M_str = "}";
  end_varname_01._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_01,end_varname_01,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(variables_,
                   "$deprecation$boolean ${$has$capitalized_name$$}$();\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$java.lang.String ${$get$capitalized_name$$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "$deprecation$com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$();\n");
  printer->Annotate("{", "}", descriptor_);
}